

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

void print_base_flags(log_level level,char *default_outfile)

{
  if (level <= G_log_level) {
    G_log_log_level = level;
    log_log_default("  -o <outfile>  sets the outfile name, default is \"%s\"\n");
  }
  if (G_log_level < level) {
    return;
  }
  G_log_log_level = level;
  log_log_default(
                 "  -q            quiet mode, disables display output\n  -v            displays version and the usage license\n  --            treats all following arguments as non-options\n  -?            displays this help screen\n"
                 );
  return;
}

Assistant:

void print_base_flags(enum log_level level, const char *default_outfile)
{
    LOG(level,
        ("  -o <outfile>  sets the outfile name, default is \"%s\"\n",
         default_outfile));
    LOG(level,
        ("  -q            quiet mode, disables display output\n"
         "  -v            displays version and the usage license\n"
         "  --            treats all following arguments as non-options\n"
         "  -?            displays this help screen\n"));
}